

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O0

void __thiscall Spc_Dsp::run(Spc_Dsp *this,int clock_count)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  byte bVar6;
  byte bVar7;
  sample_t_conflict1 *psVar8;
  short sVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int *piVar16;
  void *p;
  env_mode_t eVar17;
  int in_ESI;
  uint8_t *in_RDI;
  bool bVar18;
  sample_t_conflict1 *out;
  int r;
  int l;
  int r_2;
  int l_2;
  int (*echo_hist_pos) [2];
  int echo_in_r;
  int echo_in_l;
  uint8_t *echo_ptr;
  int echo_offset;
  int p2;
  int p1;
  int filter;
  int s;
  int *end;
  int *pos;
  int left_shift;
  int right_shift;
  int scale;
  int brr_addr;
  int brr_offset;
  int brr_block_size;
  int nybbles;
  int interp_pos;
  int old_pos;
  int mode;
  int env_data;
  int adsr0;
  int rate;
  int r_1;
  int l_1;
  int *in;
  short *rev;
  short *fwd;
  int offset;
  int output;
  int env;
  int pitch;
  int kon_delay;
  int brr_header;
  int vbit;
  uint8_t *v_regs;
  voice_t *v;
  int echo_out_r;
  int echo_out_l;
  int main_out_r;
  int main_out_l;
  int pmon_input;
  int feedback;
  int mvolr;
  int mvoll;
  int noise_rate;
  int slow_gaussian;
  uint8_t *dir;
  uint8_t *ram;
  int count;
  int new_phase;
  sample_t_conflict1 *local_130;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  int (*local_118) [2];
  uint local_fc;
  uint local_ec;
  int *local_e0;
  uint local_c8;
  int local_c4;
  env_mode_t local_b8;
  uint local_ac;
  uint local_a4;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_68;
  uint local_64;
  uint8_t *local_60;
  int *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  int local_34;
  int local_14;
  
  local_14 = (int)(*(uint *)(in_RDI + 0x11c) + in_ESI) >> 5;
  *(uint *)(in_RDI + 0x11c) = *(uint *)(in_RDI + 0x11c) + in_ESI & 0x1f;
  if (local_14 != 0) {
    psVar8 = *(sample_t_conflict1 **)(in_RDI + 0x6b8);
    bVar1 = in_RDI[0x5d];
    bVar2 = in_RDI[0x2d];
    bVar3 = in_RDI[0x3d];
    bVar4 = in_RDI[0x6c];
    local_34 = (int)(char)in_RDI[0xc];
    uVar5 = in_RDI[0x1c];
    if (local_34 * (char)uVar5 < *(int *)(in_RDI + 0x6c4)) {
      local_34 = -local_34;
    }
    do {
      uVar10 = *(uint *)(in_RDI + 0x108);
      *(uint *)(in_RDI + 0x108) = uVar10 ^ 1;
      if ((uVar10 ^ 1) != 0) {
        *(uint *)(in_RDI + 0x130) =
             (*(uint *)(in_RDI + 0x10c) ^ 0xffffffff) & *(uint *)(in_RDI + 0x130);
        *(int *)(in_RDI + 0x10c) = *(int *)(in_RDI + 0x130);
        *(uint *)(in_RDI + 0x134) = (uint)in_RDI[0x5c];
      }
      run_counter((Spc_Dsp *)in_RDI,1);
      run_counter((Spc_Dsp *)in_RDI,2);
      run_counter((Spc_Dsp *)in_RDI,3);
      if ((**(uint **)(in_RDI + (long)(int)(bVar4 & 0x1f) * 8 + 0x5b8) &
          counter_mask[(int)(bVar4 & 0x1f)]) == 0) {
        *(uint *)(in_RDI + 0x110) =
             (*(uint *)(in_RDI + 0x110) << 0xd ^ *(uint *)(in_RDI + 0x110) << 0xe) & 0x4000 ^
             (int)*(uint *)(in_RDI + 0x110) >> 1;
      }
      local_40 = 0;
      local_44 = 0;
      local_48 = 0;
      local_4c = 0;
      local_50 = 0;
      local_58 = (int *)(in_RDI + 0x138);
      local_64 = 1;
      local_60 = in_RDI;
      do {
        local_68 = (uint)*(byte *)((long)psVar8 + (long)local_58[0x1b]);
        iVar13 = local_58[0x1d];
        local_70 = get_le16(local_60 + 2);
        local_70 = local_70 & 0x3fff;
        if ((in_RDI[0x2d] & local_64) != 0) {
          local_70 = ((int)(((int)local_40 >> 5) * local_70) >> 10) + local_70;
        }
        uVar10 = iVar13 - 1;
        if (-1 < (int)uVar10) {
          local_58[0x1d] = uVar10;
          if (uVar10 == 4) {
            uVar11 = get_le16((void *)((long)psVar8 +
                                      (long)(int)((uint)local_60[4] << 2) +
                                      (long)(int)((uint)bVar1 << 8)));
            local_58[0x1b] = uVar11;
            local_58[0x1c] = 1;
            *(int **)(local_58 + 0x18) = local_58;
            local_68 = 0;
          }
          local_58[0x1f] = 0;
          local_58[0x20] = 0;
          eVar17 = env_release;
          if ((uVar10 & 3) != 0) {
            eVar17 = 0x4000;
          }
          local_58[0x1a] = eVar17;
          local_70 = 0;
        }
        local_74 = local_58[0x1f];
        local_78 = 0;
        local_60[8] = (uint8_t)((int)local_74 >> 4);
        if (local_74 != 0) {
          uVar10 = (uint)local_58[0x1a] >> 3 & 0x1fe;
          lVar15 = (long)(int)uVar10;
          piVar16 = (int *)(*(long *)(local_58 + 0x18) + (ulong)((uint)local_58[0x1a] >> 0xc) * 4);
          if ((((int)(uint)bVar2 >> 1 | (uint)bVar3) & local_64) == 0) {
            local_78 = (int)(((int)interleved_gauss[(int)uVar10] * *piVar16 +
                              (int)interleved_gauss[(long)(int)uVar10 + 1] * piVar16[1] +
                              (int)interleved_gauss[0x1ff - lVar15] * piVar16[2] +
                              (int)interleved_gauss[0x1fe - lVar15] * piVar16[3] >> 0xb) * local_74)
                       >> 0xb;
          }
          else {
            local_78 = (uint)(short)(*(uint *)(in_RDI + 0x110) << 1);
            if ((in_RDI[0x3d] & local_64) == 0) {
              local_78 = ((int)interleved_gauss[0x1fe - lVar15] * piVar16[3] >> 0xb) +
                         (int)(short)((short)((int)interleved_gauss[0x1ff - lVar15] * piVar16[2] >>
                                             0xb) +
                                     (short)((int)interleved_gauss[(long)(int)uVar10 + 1] *
                                             piVar16[1] >> 0xb) +
                                     (short)((int)interleved_gauss[(int)uVar10] * *piVar16 >> 0xb));
              if ((int)(short)local_78 != local_78) {
                local_78 = (int)local_78 >> 0x1f ^ 0x7fff;
              }
              local_78 = local_78 & 0xfffffffe;
            }
            local_78 = (int)(local_78 * local_74) >> 0xb & 0xfffffffe;
          }
          local_44 = local_78 * local_58[0x21] + local_44;
          local_48 = local_78 * local_58[0x22] + local_48;
          if ((in_RDI[0x4d] & local_64) != 0) {
            local_4c = local_78 * local_58[0x21] + local_4c;
            local_50 = local_78 * local_58[0x22] + local_50;
          }
        }
        local_40 = local_78;
        local_60[9] = (uint8_t)(local_78 >> 8);
        if (((in_RDI[0x6c] & 0x80) != 0) || ((local_68 & 3) == 1)) {
          local_58[0x1e] = 0;
          local_74 = 0;
        }
        if (*(int *)(in_RDI + 0x108) != 0) {
          if ((*(uint *)(in_RDI + 0x134) & local_64) != 0) {
            local_58[0x1e] = 0;
          }
          if ((*(uint *)(in_RDI + 0x10c) & local_64) != 0) {
            local_58[0x1d] = 5;
            local_58[0x1e] = 1;
            in_RDI[0x7c] = (byte)*(int *)(in_RDI + 0x7c) & ((byte)local_64 ^ 0xff);
          }
        }
        if (local_58[0x1d] == 0) {
          if (local_58[0x1e] != 0) {
            uVar10 = (uint)local_60[5];
            local_ac = (uint)local_60[6];
            if (uVar10 < 0x80) {
              local_ac = (uint)local_60[7];
              uVar10 = (int)local_ac >> 5;
              if (uVar10 < 4) {
                local_a4 = 0x1f;
                uVar11 = local_ac << 4;
              }
              else {
                local_a4 = local_ac & 0x1f;
                if (uVar10 == 4) {
                  uVar11 = local_74 - 0x20;
                }
                else if (uVar10 < 6) {
                  uVar11 = (local_74 + -1) - ((int)(local_74 + -1) >> 8);
                }
                else {
                  uVar11 = local_74 + 0x20;
                  if ((6 < uVar10) && (0x5ff < (uint)local_58[0x20])) {
                    uVar11 = local_74 + 8;
                  }
                }
              }
            }
            else {
              if (2 < local_58[0x1e]) {
                iVar13 = (local_74 + -1) - ((int)(local_74 + -1) >> 8);
                local_58[0x20] = iVar13;
                if ((**(uint **)(in_RDI + (long)(int)(local_ac & 0x1f) * 8 + 0x5b8) &
                    counter_mask[(int)(local_ac & 0x1f)]) == 0) {
                  local_58[0x1f] = iVar13;
                }
                goto LAB_00839622;
              }
              if (local_58[0x1e] == 2) {
                local_a4 = ((int)uVar10 >> 3 & 0xeU) + 0x10;
                uVar11 = (local_74 + -1) - ((int)(local_74 + -1) >> 8);
              }
              else {
                local_a4 = (uVar10 & 0xf) * 2 + 1;
                iVar13 = 0x400;
                if (local_a4 < 0x1f) {
                  iVar13 = 0x20;
                }
                uVar11 = iVar13 + local_74;
              }
            }
            local_74 = uVar11;
            if (((int)local_74 >> 8 == (int)local_ac >> 5) && (local_58[0x1e] == 2)) {
              local_58[0x1e] = 3;
            }
            local_58[0x20] = local_74;
            if (0x7ff < local_74) {
              bVar18 = (int)local_74 < 0;
              local_74 = 0x7ff;
              if (bVar18) {
                local_74 = 0;
              }
              if (local_58[0x1e] == 1) {
                local_58[0x1e] = 2;
              }
            }
            if ((**(uint **)(in_RDI + (long)(int)local_a4 * 8 + 0x5b8) & counter_mask[(int)local_a4]
                ) == 0) {
              local_58[0x1f] = local_74;
            }
            goto LAB_00839622;
          }
          local_58[0x1f] = local_74 + -8;
          if (0 < (int)(local_74 + -8)) goto LAB_00839622;
          local_58[0x1f] = 0;
        }
        else {
LAB_00839622:
          eVar17 = local_58[0x1a];
          local_b8 = (eVar17 & 0x3fff) + local_70;
          if (0x7fff < (int)local_b8) {
            local_b8 = 0x7fff;
          }
          local_58[0x1a] = local_b8;
          if (0x3fff < (int)eVar17) {
            sVar9 = (ushort)*(byte *)((long)psVar8 +
                                     (long)(int)(local_58[0x1b] + local_58[0x1c] & 0xffff)) * 0x100
                    + (ushort)*(byte *)((long)psVar8 +
                                       (long)(int)(local_58[0x1b] + local_58[0x1c] + 1U & 0xffff));
            local_c4 = local_58[0x1c] + 2;
            if (8 < local_c4) {
              local_c8 = local_58[0x1b] + 9U & 0xffff;
              if (((local_68 & 1) != 0) &&
                 (local_c8 = get_le16((void *)((long)psVar8 +
                                              (long)(int)((uint)local_60[4] * 4 + 2) +
                                              (long)(int)((uint)bVar1 << 8))), local_58[0x1d] == 0))
              {
                in_RDI[0x7c] = (byte)*(int *)(in_RDI + 0x7c) | (byte)local_64;
              }
              local_58[0x1b] = local_c8;
              local_c4 = 1;
            }
            local_58[0x1c] = local_c4;
            bVar6 = "\r\f\f\f\f\f\f\f\f\f\f\f\f\x10\x10\x10"[(int)local_68 >> 4];
            bVar7 = "\r\f\f\f\f\f\f\f\f\f\f\f\f\x10\x10\x10"[((int)local_68 >> 4) + 0x10];
            local_e0 = *(int **)(local_58 + 0x18);
            piVar16 = local_e0 + 4;
            for (; local_e0 < piVar16; local_e0 = local_e0 + 1) {
              local_ec = ((int)sVar9 >> (bVar6 & 0x1f)) << (bVar7 & 0x1f);
              uVar10 = local_68 & 0xc;
              iVar13 = local_e0[0xb];
              iVar14 = local_e0[10] >> 1;
              if (uVar10 < 8) {
                if (uVar10 != 0) {
                  local_ec = (-iVar13 >> 5) + (iVar13 >> 1) + local_ec;
                }
              }
              else {
                iVar12 = (iVar13 + local_ec) - iVar14;
                if (uVar10 == 8) {
                  local_ec = (iVar13 * -3 >> 6) + (local_e0[10] >> 5) + iVar12;
                }
                else {
                  local_ec = (iVar14 * 3 >> 4) + (iVar13 * -0xd >> 7) + iVar12;
                }
              }
              if ((int)(short)local_ec != local_ec) {
                local_ec = (int)local_ec >> 0x1f ^ 0x7fff;
              }
              iVar13 = (int)(short)(local_ec << 1);
              *local_e0 = iVar13;
              local_e0[0xc] = iVar13;
              sVar9 = sVar9 << 4;
            }
            if (local_58 + 0xc <= local_e0) {
              local_e0 = local_58;
            }
            *(int **)(local_58 + 0x18) = local_e0;
          }
        }
        local_64 = local_64 << 1;
        local_60 = local_60 + 0x10;
        local_58 = local_58 + 0x24;
      } while ((int)local_64 < 0x100);
      local_fc = *(uint *)(in_RDI + 0x114);
      p = (void *)((long)psVar8 + (long)(int)((uint)in_RDI[0x6d] * 0x100 + local_fc & 0xffff));
      if (local_fc == 0) {
        *(uint *)(in_RDI + 0x118) = (in_RDI[0x7d] & 0xf) << 0xb;
      }
      local_fc = local_fc + 4;
      if ((int)*(uint *)(in_RDI + 0x118) <= (int)local_fc) {
        local_fc = 0;
      }
      *(uint *)(in_RDI + 0x114) = local_fc;
      uVar10 = get_le16(p);
      iVar13 = (int)(short)uVar10;
      uVar10 = get_le16((void *)((long)p + 2));
      iVar14 = (int)(short)uVar10;
      local_118 = (int (*) [2])(*(long *)(in_RDI + 0x100) + 8);
      if ((int (*) [2])(in_RDI + 0xc0) <= local_118) {
        local_118 = (int (*) [2])(in_RDI + 0x80);
      }
      *(int (**) [2])(in_RDI + 0x100) = local_118;
      local_118[8][0] = iVar13;
      (*local_118)[0] = iVar13;
      local_118[8][1] = iVar14;
      (*local_118)[1] = iVar14;
      iVar13 = local_118[7][0] * (int)(char)in_RDI[0x6f] +
               local_118[6][0] * (int)(char)in_RDI[0x5f] +
               local_118[5][0] * (int)(char)in_RDI[0x4f] +
               local_118[4][0] * (int)(char)in_RDI[0x3f] +
               local_118[3][0] * (int)(char)in_RDI[0x2f] +
               local_118[2][0] * (int)(char)in_RDI[0x1f] +
               local_118[1][0] * (int)(char)in_RDI[0xf] + iVar13 * (char)in_RDI[0x7f];
      iVar14 = local_118[7][1] * (int)(char)in_RDI[0x6f] +
               local_118[6][1] * (int)(char)in_RDI[0x5f] +
               local_118[5][1] * (int)(char)in_RDI[0x4f] +
               local_118[4][1] * (int)(char)in_RDI[0x3f] +
               local_118[3][1] * (int)(char)in_RDI[0x2f] +
               local_118[2][1] * (int)(char)in_RDI[0x1f] +
               local_118[1][1] * (int)(char)in_RDI[0xf] + iVar14 * (char)in_RDI[0x7f];
      if ((in_RDI[0x6c] & 0x20) == 0) {
        local_11c = (local_4c >> 7) + (iVar13 * (char)in_RDI[0xd] >> 0xe);
        local_120 = (local_50 >> 7) + (iVar14 * (char)in_RDI[0xd] >> 0xe);
        if ((int)(short)local_11c != local_11c) {
          local_11c = (int)local_11c >> 0x1f ^ 0x7fff;
        }
        if ((int)(short)local_120 != local_120) {
          local_120 = (int)local_120 >> 0x1f ^ 0x7fff;
        }
        set_le16(p,local_11c);
        set_le16((void *)((long)p + 2),local_120);
      }
      iVar13 = local_44 * local_34 + iVar13 * (char)in_RDI[0x2c];
      local_124 = iVar13 >> 0xe;
      iVar14 = local_48 * (char)uVar5 + iVar14 * (char)in_RDI[0x3c];
      local_128 = iVar14 >> 0xe;
      if ((int)(short)local_124 != local_124) {
        local_124 = iVar13 >> 0x1f ^ 0x7fff;
      }
      if ((int)(short)local_128 != local_128) {
        local_128 = iVar14 >> 0x1f ^ 0x7fff;
      }
      if ((in_RDI[0x6c] & 0x40) != 0) {
        local_124._0_2_ = 0;
        local_128._0_2_ = 0;
      }
      local_130 = *(sample_t_conflict1 **)(in_RDI + 0x6c8);
      *local_130 = (sample_t_conflict1)local_124;
      local_130[1] = (sample_t_conflict1)local_128;
      local_130 = local_130 + 2;
      if (*(sample_t_conflict1 **)(in_RDI + 0x6d0) <= local_130) {
        local_130 = (sample_t_conflict1 *)(in_RDI + 0x6e0);
        *(uint8_t **)(in_RDI + 0x6d0) = in_RDI + 0x700;
      }
      *(sample_t_conflict1 **)(in_RDI + 0x6c8) = local_130;
      local_14 = local_14 + -1;
    } while (local_14 != 0);
  }
  return;
}

Assistant:

void Spc_Dsp::run( int clock_count )
{
	int new_phase = m.phase + clock_count;
	int count = new_phase >> 5;
	m.phase = new_phase & 31;
	if ( !count )
		return;
	
	uint8_t* const ram = m.ram;
	uint8_t const* const dir = &ram [REG(dir) * 0x100];
	int const slow_gaussian = (REG(pmon) >> 1) | REG(non);
	int const noise_rate = REG(flg) & 0x1F;
	
	// Global volume
	int mvoll = (int8_t) REG(mvoll);
	int mvolr = (int8_t) REG(mvolr);
	if ( mvoll * mvolr < m.surround_threshold )
		mvoll = -mvoll; // eliminate surround
	
	do
	{
		// KON/KOFF reading
		if ( (m.every_other_sample ^= 1) != 0 )
		{
			m.new_kon &= ~m.kon;
			m.kon    = m.new_kon;
			m.t_koff = REG(koff); 
		}
		
		run_counter( 1 );
		run_counter( 2 );
		run_counter( 3 );
		
		// Noise
		if ( !READ_COUNTER( noise_rate ) )
		{
			int feedback = (m.noise << 13) ^ (m.noise << 14);
			m.noise = (feedback & 0x4000) ^ (m.noise >> 1);
		}
		
		// Voices
		int pmon_input = 0;
		int main_out_l = 0;
		int main_out_r = 0;
		int echo_out_l = 0;
		int echo_out_r = 0;
		voice_t* v = m.voices;
		uint8_t* v_regs = m.regs;
		int vbit = 1;
		do
		{
			#define SAMPLE_PTR(i) GET_LE16A( &dir [VREG(v_regs,srcn) * 4 + i * 2] )
			
			int brr_header = ram [v->brr_addr];
			int kon_delay = v->kon_delay;
			
			// Pitch
			int pitch = GET_LE16A( &VREG(v_regs,pitchl) ) & 0x3FFF;
			if ( REG(pmon) & vbit )
				pitch += ((pmon_input >> 5) * pitch) >> 10;
			
			// KON phases
			if ( --kon_delay >= 0 )
			{
				v->kon_delay = kon_delay;
				
				// Get ready to start BRR decoding on next sample
				if ( kon_delay == 4 )
				{
					v->brr_addr   = SAMPLE_PTR( 0 );
					v->brr_offset = 1;
					v->buf_pos    = v->buf;
					brr_header    = 0; // header is ignored on this sample
				}
				
				// Envelope is never run during KON
				v->env        = 0;
				v->hidden_env = 0;
				
				// Disable BRR decoding until last three samples
				v->interp_pos = (kon_delay & 3 ? 0x4000 : 0);
				
				// Pitch is never added during KON
				pitch = 0;
			}
			
			int env = v->env;
			
			// Gaussian interpolation
			{
				int output = 0;
				VREG(v_regs,envx) = (uint8_t) (env >> 4);
				if ( env )
				{
					// Make pointers into gaussian based on fractional position between samples
					int offset = (unsigned) v->interp_pos >> 3 & 0x1FE;
					short const* fwd = interleved_gauss       + offset;
					short const* rev = interleved_gauss + 510 - offset; // mirror left half of gaussian
					
					int const* in = &v->buf_pos [(unsigned) v->interp_pos >> 12];
					
					if ( !(slow_gaussian & vbit) ) // 99%
					{
						// Faster approximation when exact sample value isn't necessary for pitch mod
						output = (fwd [0] * in [0] +
						          fwd [1] * in [1] +
						          rev [1] * in [2] +
						          rev [0] * in [3]) >> 11;
						output = (output * env) >> 11;
					}
					else
					{
						output = (int16_t) (m.noise * 2);
						if ( !(REG(non) & vbit) )
						{
							output  = (fwd [0] * in [0]) >> 11;
							output += (fwd [1] * in [1]) >> 11;
							output += (rev [1] * in [2]) >> 11;
							output = (int16_t) output;
							output += (rev [0] * in [3]) >> 11;
							
							CLAMP16( output );
							output &= ~1;
						}
						output = (output * env) >> 11 & ~1;
					}
					
					// Output
					int l = output * v->volume [0];
					int r = output * v->volume [1];
					
					main_out_l += l;
					main_out_r += r;
					
					if ( REG(eon) & vbit )
					{
						echo_out_l += l;
						echo_out_r += r;
					}
				}
				
				pmon_input = output;
				VREG(v_regs,outx) = (uint8_t) (output >> 8);
			}
			
			// Soft reset or end of sample
			if ( REG(flg) & 0x80 || (brr_header & 3) == 1 )
			{
				v->env_mode = env_release;
				env         = 0;
			}
			
			if ( m.every_other_sample )
			{
				// KOFF
				if ( m.t_koff & vbit )
					v->env_mode = env_release;
				
				// KON
				if ( m.kon & vbit )
				{
					v->kon_delay = 5;
					v->env_mode  = env_attack;
					REG(endx) &= ~vbit;
				}
			}
			
			// Envelope
			if ( !v->kon_delay )
			{
				if ( v->env_mode == env_release ) // 97%
				{
					env -= 0x8;
					v->env = env;
					if ( env <= 0 )
					{
						v->env = 0;
						goto skip_brr; // no BRR decoding for you!
					}
				}
				else // 3%
				{
					int rate;
					int const adsr0 = VREG(v_regs,adsr0);
					int env_data = VREG(v_regs,adsr1);
					if ( adsr0 >= 0x80 ) // 97% ADSR
					{
						if ( v->env_mode > env_decay ) // 89%
						{
							env--;
							env -= env >> 8;
							rate = env_data & 0x1F;
							
							// optimized handling
							v->hidden_env = env;
							if ( READ_COUNTER( rate ) )
								goto exit_env;
							v->env = env;
							goto exit_env;
						}
						else if ( v->env_mode == env_decay )
						{
							env--;
							env -= env >> 8;
							rate = (adsr0 >> 3 & 0x0E) + 0x10;
						}
						else // env_attack
						{
							rate = (adsr0 & 0x0F) * 2 + 1;
							env += rate < 31 ? 0x20 : 0x400;
						}
					}
					else // GAIN
					{
						int mode;
						env_data = VREG(v_regs,gain);
						mode = env_data >> 5;
						if ( mode < 4 ) // direct
						{
							env = env_data * 0x10;
							rate = 31;
						}
						else
						{
							rate = env_data & 0x1F;
							if ( mode == 4 ) // 4: linear decrease
							{
								env -= 0x20;
							}
							else if ( mode < 6 ) // 5: exponential decrease
							{
								env--;
								env -= env >> 8;
							}
							else // 6,7: linear increase
							{
								env += 0x20;
								if ( mode > 6 && (unsigned) v->hidden_env >= 0x600 )
									env += 0x8 - 0x20; // 7: two-slope linear increase
							}
						}
					}
					
					// Sustain level
					if ( (env >> 8) == (env_data >> 5) && v->env_mode == env_decay )
						v->env_mode = env_sustain;
					
					v->hidden_env = env;
					
					// unsigned cast because linear decrease going negative also triggers this
					if ( (unsigned) env > 0x7FF )
					{
						env = (env < 0 ? 0 : 0x7FF);
						if ( v->env_mode == env_attack )
							v->env_mode = env_decay;
					}
					
					if ( !READ_COUNTER( rate ) )
						v->env = env; // nothing else is controlled by the counter
				}
			}
		exit_env:
			
			{
				// Apply pitch
				int old_pos = v->interp_pos;
				int interp_pos = (old_pos & 0x3FFF) + pitch;
				if ( interp_pos > 0x7FFF )
					interp_pos = 0x7FFF;
				v->interp_pos = interp_pos;
				
				// BRR decode if necessary
				if ( old_pos >= 0x4000 )
				{
					// Arrange the four input nybbles in 0xABCD order for easy decoding
					int nybbles = ram [(v->brr_addr + v->brr_offset) & 0xFFFF] * 0x100 +
							ram [(v->brr_addr + v->brr_offset + 1) & 0xFFFF];
					
					// Advance read position
					int const brr_block_size = 9;
					int brr_offset = v->brr_offset;
					if ( (brr_offset += 2) >= brr_block_size )
					{
						// Next BRR block
						int brr_addr = (v->brr_addr + brr_block_size) & 0xFFFF;
						assert( brr_offset == brr_block_size );
						if ( brr_header & 1 )
						{
							brr_addr = SAMPLE_PTR( 1 );
							if ( !v->kon_delay )
								REG(endx) |= vbit;
						}
						v->brr_addr = brr_addr;
						brr_offset  = 1;
					}
					v->brr_offset = brr_offset;
					
					// Decode
					
					// 0: >>1  1: <<0  2: <<1 ... 12: <<11  13-15: >>4 <<11
					static unsigned char const shifts [16 * 2] = {
						13,12,12,12,12,12,12,12,12,12,12, 12, 12, 16, 16, 16,
						 0, 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 11, 11, 11
					};
					int const scale = brr_header >> 4;
					int const right_shift = shifts [scale];
					int const left_shift  = shifts [scale + 16];
					
					// Write to next four samples in circular buffer
					int* pos = v->buf_pos;
					int* end;
					
					// Decode four samples
					for ( end = pos + 4; pos < end; pos++, nybbles <<= 4 )
					{
						// Extract upper nybble and scale appropriately
						int s = ((int16_t) nybbles >> right_shift) << left_shift;
						
						// Apply IIR filter (8 is the most commonly used)
						int const filter = brr_header & 0x0C;
						int const p1 = pos [brr_buf_size - 1];
						int const p2 = pos [brr_buf_size - 2] >> 1;
						if ( filter >= 8 )
						{
							s += p1;
							s -= p2;
							if ( filter == 8 ) // s += p1 * 0.953125 - p2 * 0.46875
							{
								s += p2 >> 4;
								s += (p1 * -3) >> 6;
							}
							else // s += p1 * 0.8984375 - p2 * 0.40625
							{
								s += (p1 * -13) >> 7;
								s += (p2 * 3) >> 4;
							}
						}
						else if ( filter ) // s += p1 * 0.46875
						{
							s += p1 >> 1;
							s += (-p1) >> 5;
						}
						
						// Adjust and write sample
						CLAMP16( s );
						s = (int16_t) (s * 2);
						pos [brr_buf_size] = pos [0] = s; // second copy simplifies wrap-around
					}
					
					if ( pos >= &v->buf [brr_buf_size] )
						pos = v->buf;
					v->buf_pos = pos;
				}
			}
skip_brr:
			// Next voice
			vbit <<= 1;
			v_regs += 0x10;
			v++;
		}
		while ( vbit < 0x100 );
		
		// Echo position
		int echo_offset = m.echo_offset;
		uint8_t* const echo_ptr = &ram [(REG(esa) * 0x100 + echo_offset) & 0xFFFF];
		if ( !echo_offset )
			m.echo_length = (REG(edl) & 0x0F) * 0x800;
		echo_offset += 4;
		if ( echo_offset >= m.echo_length )
			echo_offset = 0;
		m.echo_offset = echo_offset;
		
		// FIR
		int echo_in_l = GET_LE16SA( echo_ptr + 0 );
		int echo_in_r = GET_LE16SA( echo_ptr + 2 );
		
		int (*echo_hist_pos) [2] = m.echo_hist_pos;
		if ( ++echo_hist_pos >= &m.echo_hist [echo_hist_size] )
			echo_hist_pos = m.echo_hist;
		m.echo_hist_pos = echo_hist_pos;
		
		echo_hist_pos [0] [0] = echo_hist_pos [8] [0] = echo_in_l;
		echo_hist_pos [0] [1] = echo_hist_pos [8] [1] = echo_in_r;
		
		#define CALC_FIR_( i, in )  ((in) * (int8_t) REG(fir + i * 0x10))
		echo_in_l = CALC_FIR_( 7, echo_in_l );
		echo_in_r = CALC_FIR_( 7, echo_in_r );
		
		#define CALC_FIR( i, ch )   CALC_FIR_( i, echo_hist_pos [i + 1] [ch] )
		#define DO_FIR( i )\
			echo_in_l += CALC_FIR( i, 0 );\
			echo_in_r += CALC_FIR( i, 1 );
		DO_FIR( 0 );
		DO_FIR( 1 );
		DO_FIR( 2 );
		#if defined (__MWERKS__) && __MWERKS__ < 0x3200
			__eieio(); // keeps compiler from stupidly "caching" things in memory
		#endif
		DO_FIR( 3 );
		DO_FIR( 4 );
		DO_FIR( 5 );
		DO_FIR( 6 );
		
		// Echo out
		if ( !(REG(flg) & 0x20) )
		{
			int l = (echo_out_l >> 7) + ((echo_in_l * (int8_t) REG(efb)) >> 14);
			int r = (echo_out_r >> 7) + ((echo_in_r * (int8_t) REG(efb)) >> 14);
			
			// just to help pass more validation tests
			#if SPC_MORE_ACCURACY
				l &= ~1;
				r &= ~1;
			#endif
			
			CLAMP16( l );
			CLAMP16( r );
			
			SET_LE16A( echo_ptr + 0, l );
			SET_LE16A( echo_ptr + 2, r );
		}
		
		// Sound out
		int l = (main_out_l * mvoll + echo_in_l * (int8_t) REG(evoll)) >> 14;
		int r = (main_out_r * mvolr + echo_in_r * (int8_t) REG(evolr)) >> 14;
		
		CLAMP16( l );
		CLAMP16( r );
		
		if ( (REG(flg) & 0x40) )
		{
			l = 0;
			r = 0;
		}
		
		sample_t* out = m.out;
		WRITE_SAMPLES( l, r, out );
		m.out = out;
	}
	while ( --count );
}